

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O3

int __thiscall MixerContext::auto_matrix(MixerContext *this)

{
  cubeb_sample_format cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  cubeb_channel_layout layout;
  cubeb_channel_layout layout_00;
  uint uVar7;
  cubeb_log_level cVar8;
  cubeb_log_callback p_Var9;
  double (*padVar10) [32];
  uint32_t i;
  long lVar11;
  ulong uVar12;
  uint32_t i_2;
  char *fmt;
  float (*pafVar13) [32];
  uint32_t line;
  undefined8 *puVar14;
  double (*padVar15) [32];
  ulong uVar16;
  long lVar17;
  uint32_t j;
  ulong uVar18;
  int iVar19;
  undefined8 *puVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  undefined8 local_a48 [2];
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a18;
  double local_a08;
  double local_a00;
  double local_9a8;
  double local_9a0;
  double local_990;
  double local_980;
  double local_978;
  double local_968;
  undefined1 local_928 [16];
  double local_918;
  double local_910;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  double local_8e8;
  undefined1 local_8e0 [280];
  double local_7c8;
  double local_7c0;
  double local_738;
  double local_728;
  undefined1 local_5a8 [40];
  undefined1 local_580 [104];
  double local_518;
  double local_4f8;
  double local_480;
  double local_468;
  
  puVar20 = local_a48;
  puVar14 = local_a48;
  memset(local_a48,0,0xa20);
  layout = clean_layout(this->_in_ch_layout);
  layout_00 = clean_layout(this->_out_ch_layout);
  bVar6 = sane_layout(layout);
  if (!bVar6) {
    cVar8 = cubeb_log_get_level();
    if ((int)cVar8 < 1) {
      return -1;
    }
    p_Var9 = cubeb_log_get_callback();
    if (p_Var9 == (cubeb_log_callback)0x0) {
      return -1;
    }
    uVar7 = this->_in_ch_layout;
    fmt = "Input Layout %x is not supported";
    line = 0xc1;
LAB_00111e70:
    cubeb_log_internal("cubeb_mixer.cpp",line,fmt,(ulong)uVar7);
    return -1;
  }
  bVar6 = sane_layout(layout_00);
  if (!bVar6) {
    cVar8 = cubeb_log_get_level();
    if ((int)cVar8 < 1) {
      return -1;
    }
    p_Var9 = cubeb_log_get_callback();
    if (p_Var9 == (cubeb_log_callback)0x0) {
      return -1;
    }
    uVar7 = this->_out_ch_layout;
    fmt = "Output Layout %x is not supported";
    line = 0xc6;
    goto LAB_00111e70;
  }
  lVar11 = 0;
  do {
    if ((1 << ((byte)lVar11 & 0x1f) & layout & layout_00) != 0) {
      *puVar20 = 0x3ff0000000000000;
    }
    lVar11 = lVar11 + 1;
    puVar20 = puVar20 + 0x13;
  } while (lVar11 != 0x12);
  uVar7 = layout & ~layout_00;
  if (((~layout_00 & 3) == 0) && ((uVar7 & 4) != 0)) {
    if ((layout & 3) == 0) {
      dVar24 = 0.7071067811865476;
    }
    else {
      dVar24 = (double)this->_center_mix_level;
    }
    local_a38 = local_a38 + dVar24;
    local_9a8 = dVar24 + local_9a8;
  }
  if (((layout_00 & 4) != 0) && ((uVar7 & 3) != 0)) {
    auVar23._8_4_ = SUB84((double)local_928._8_8_ + 0.7071067811865476,0);
    auVar23._0_8_ = (double)local_928._0_8_ + 0.7071067811865476;
    auVar23._12_4_ = (int)((ulong)((double)local_928._8_8_ + 0.7071067811865476) >> 0x20);
    local_928 = auVar23;
    if ((layout & 4) != 0) {
      local_918 = (double)this->_center_mix_level * 1.4142135623730951;
    }
  }
  if ((uVar7 >> 8 & 1) != 0) {
    if ((layout_00 & 0x10) == 0) {
      if ((layout_00 >> 9 & 1) == 0) {
        if ((layout_00 & 1) == 0) {
          if ((layout_00 & 4) != 0) {
            local_8e8 = (double)this->_surround_mix_level * 0.7071067811865476 + local_8e8;
          }
        }
        else {
          dVar24 = (double)this->_surround_mix_level * 0.7071067811865476;
          local_a08 = local_a08 + dVar24;
          local_978 = dVar24 + local_978;
        }
      }
      else {
        local_4f8 = local_4f8 + 0.7071067811865476;
        local_468 = local_468 + 0.7071067811865476;
      }
    }
    else {
      local_7c8 = local_7c8 + 0.7071067811865476;
      local_738 = local_738 + 0.7071067811865476;
    }
  }
  if ((uVar7 & 0x10) != 0) {
    if ((layout_00 >> 8 & 1) == 0) {
      if ((layout_00 >> 9 & 1) == 0) {
        if ((layout_00 & 1) == 0) {
          if ((layout_00 & 4) != 0) {
            dVar24 = (double)this->_surround_mix_level * 0.7071067811865476;
            dVar25 = dVar24 + (double)local_908._8_8_;
            local_908._8_4_ = SUB84(dVar25,0);
            local_908._0_8_ = dVar24 + (double)local_908._0_8_;
            local_908._12_4_ = (int)((ulong)dVar25 >> 0x20);
          }
        }
        else {
          local_a28 = local_a28 + (double)this->_surround_mix_level;
          local_990 = (double)this->_surround_mix_level + local_990;
        }
      }
      else {
        if ((layout >> 9 & 1) == 0) {
          dVar24 = 1.0;
        }
        else {
          dVar24 = 0.7071067811865476;
        }
        local_518 = local_518 + dVar24;
        local_480 = dVar24 + local_480;
      }
    }
    else {
      auVar5._8_4_ = SUB84((double)local_5a8._8_8_ + 0.7071067811865476,0);
      auVar5._0_8_ = (double)local_5a8._0_8_ + 0.7071067811865476;
      auVar5._12_4_ = (int)((ulong)((double)local_5a8._8_8_ + 0.7071067811865476) >> 0x20);
      local_5a8._0_16_ = auVar5;
    }
  }
  if ((uVar7 >> 9 & 1) != 0) {
    if ((layout_00 & 0x10) == 0) {
      if ((layout_00 >> 8 & 1) == 0) {
        if ((layout_00 & 1) == 0) {
          if ((layout_00 & 4) != 0) {
            dVar24 = (double)this->_surround_mix_level * 0.7071067811865476;
            dVar25 = dVar24 + (double)local_8e0._8_8_;
            local_8e0._8_4_ = SUB84(dVar25,0);
            local_8e0._0_8_ = dVar24 + (double)local_8e0._0_8_;
            local_8e0._12_4_ = (int)((ulong)dVar25 >> 0x20);
          }
        }
        else {
          local_a00 = local_a00 + (double)this->_surround_mix_level;
          local_968 = (double)this->_surround_mix_level + local_968;
        }
      }
      else {
        auVar4._8_4_ = SUB84((double)local_580._8_8_ + 0.7071067811865476,0);
        auVar4._0_8_ = (double)local_580._0_8_ + 0.7071067811865476;
        auVar4._12_4_ = (int)((ulong)((double)local_580._8_8_ + 0.7071067811865476) >> 0x20);
        local_580._0_16_ = auVar4;
      }
    }
    else {
      if ((layout & 0x10) == 0) {
        dVar24 = 1.0;
      }
      else {
        dVar24 = 0.7071067811865476;
      }
      local_7c0 = local_7c0 + dVar24;
      local_728 = dVar24 + local_728;
    }
  }
  if ((uVar7 & 0x40) == 0) {
LAB_001121c1:
    if ((uVar7 & 8) == 0) goto LAB_0011221f;
    if ((layout_00 & 4) == 0) {
      if ((layout_00 & 1) != 0) {
        dVar24 = (double)this->_lfe_mix_level * 0.7071067811865476;
        local_a30 = local_a30 + dVar24;
        local_9a0 = dVar24 + local_9a0;
      }
      goto LAB_0011221f;
    }
  }
  else {
    if ((layout_00 & 1) != 0) {
      local_a18 = local_a18 + 1.0;
      local_980 = local_980 + 1.0;
      goto LAB_001121c1;
    }
    if ((layout_00 & 4) == 0) goto LAB_0011221f;
    auVar2._8_4_ = SUB84((double)local_8f8._8_8_ + 0.7071067811865476,0);
    auVar2._0_8_ = (double)local_8f8._0_8_ + 0.7071067811865476;
    auVar2._12_4_ = (int)((ulong)((double)local_8f8._8_8_ + 0.7071067811865476) >> 0x20);
    local_8f8 = auVar2;
    if ((uVar7 & 8) == 0) goto LAB_0011221f;
  }
  local_910 = (double)this->_lfe_mix_level + local_910;
LAB_0011221f:
  padVar10 = this->_matrix;
  uVar21 = 0;
  uVar22 = 0;
  uVar12 = 0;
  uVar16 = 0;
  do {
    if ((layout_00 >> ((uint)uVar12 & 0x1f) & 1) != 0) {
      dVar24 = 0.0;
      dVar25 = 1.0;
      if ((layout_00 & layout & 1 << ((byte)uVar12 & 0x1f)) == 0) {
        dVar25 = 0.0;
      }
      uVar18 = 0;
      iVar19 = 0;
      do {
        if ((layout >> ((uint)uVar18 & 0x1f) & 1) != 0) {
          if (uVar18 < 0x12 && uVar12 < 0x12) {
            dVar26 = *(double *)((long)puVar14 + uVar18 * 8);
          }
          else {
            dVar26 = dVar25;
            if (uVar12 != uVar18) {
              dVar26 = 0.0;
            }
          }
          padVar10[uVar16][iVar19] = dVar26;
          dVar24 = dVar24 + ABS(dVar26);
          iVar19 = iVar19 + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 0x20);
      if (dVar24 <= (double)CONCAT44(uVar22,uVar21)) {
        dVar24 = (double)CONCAT44(uVar22,uVar21);
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      uVar21 = SUB84(dVar24,0);
      uVar22 = (undefined4)((ulong)dVar24 >> 0x20);
    }
    uVar12 = uVar12 + 1;
    puVar14 = (undefined8 *)((long)puVar14 + 0x90);
  } while (uVar12 != 0x20);
  cVar1 = this->_format;
  dVar24 = *(double *)(&DAT_00143450 + (ulong)(cVar1 == CUBEB_SAMPLE_S16LE) * 8);
  if (dVar24 <= (double)CONCAT44(uVar22,uVar21) && (double)CONCAT44(uVar22,uVar21) != dVar24) {
    dVar24 = (double)CONCAT44(uVar22,uVar21) / dVar24;
    lVar11 = 0;
    padVar15 = padVar10;
    do {
      lVar17 = 0;
      do {
        auVar3._8_4_ = SUB84(dVar24,0);
        auVar3._0_8_ = dVar24;
        auVar3._12_4_ = (int)((ulong)dVar24 >> 0x20);
        auVar23 = divpd(*(undefined1 (*) [16])(*padVar15 + lVar17),auVar3);
        *(undefined1 (*) [16])(*padVar15 + lVar17) = auVar23;
        lVar17 = lVar17 + 2;
      } while (lVar17 != 0x20);
      lVar11 = lVar11 + 1;
      padVar15 = padVar15 + 1;
    } while (lVar11 != 0x20);
  }
  if (cVar1 == CUBEB_SAMPLE_FLOAT32LE) {
    pafVar13 = this->_matrix_flt;
    lVar11 = 0;
    do {
      lVar17 = 0;
      do {
        *(ulong *)(*pafVar13 + lVar17) =
             CONCAT44((float)(*padVar10 + lVar17)[1],(float)(*padVar10)[lVar17]);
        lVar17 = lVar17 + 2;
      } while (lVar17 != 0x20);
      lVar11 = lVar11 + 1;
      padVar10 = padVar10 + 1;
      pafVar13 = pafVar13 + 1;
    } while (lVar11 != 0x20);
  }
  return 0;
}

Assistant:

int
MixerContext::auto_matrix()
{
  double matrix[NUM_NAMED_CHANNELS][NUM_NAMED_CHANNELS] = {{0}};
  double maxcoef = 0;
  double maxval;

  cubeb_channel_layout in_ch_layout = clean_layout(_in_ch_layout);
  cubeb_channel_layout out_ch_layout = clean_layout(_out_ch_layout);

  if (!sane_layout(in_ch_layout)) {
    // Channel Not Supported
    LOG("Input Layout %x is not supported", _in_ch_layout);
    return -1;
  }

  if (!sane_layout(out_ch_layout)) {
    LOG("Output Layout %x is not supported", _out_ch_layout);
    return -1;
  }

  for (uint32_t i = 0; i < FF_ARRAY_ELEMS(matrix); i++) {
    if (in_ch_layout & out_ch_layout & (1U << i)) {
      matrix[i][i] = 1.0;
    }
  }

  cubeb_channel_layout unaccounted = in_ch_layout & ~out_ch_layout;

  // Rematrixing is done via a matrix of coefficient that should be applied to
  // all channels. Channels are treated as pair and must be symmetrical (if a
  // left channel exists, the corresponding right should exist too) unless the
  // output layout has similar layout. Channels are then mixed toward the front
  // center or back center if they exist with a slight bias toward the front.

  if (unaccounted & CHANNEL_FRONT_CENTER) {
    if ((out_ch_layout & CUBEB_LAYOUT_STEREO) == CUBEB_LAYOUT_STEREO) {
      if (in_ch_layout & CUBEB_LAYOUT_STEREO) {
        matrix[FRONT_LEFT][FRONT_CENTER] += _center_mix_level;
        matrix[FRONT_RIGHT][FRONT_CENTER] += _center_mix_level;
      } else {
        matrix[FRONT_LEFT][FRONT_CENTER] += M_SQRT1_2;
        matrix[FRONT_RIGHT][FRONT_CENTER] += M_SQRT1_2;
      }
    }
  }
  if (unaccounted & CUBEB_LAYOUT_STEREO) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT] += M_SQRT1_2;
      if (in_ch_layout & CHANNEL_FRONT_CENTER)
        matrix[FRONT_CENTER][FRONT_CENTER] = _center_mix_level * M_SQRT2;
    }
  }

  if (unaccounted & CHANNEL_BACK_CENTER) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      matrix[BACK_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[BACK_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      matrix[SIDE_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[SIDE_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    }
  }
  if (unaccounted & CHANNEL_BACK_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][BACK_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][BACK_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      if (in_ch_layout & CHANNEL_SIDE_LEFT) {
        matrix[SIDE_LEFT][BACK_LEFT] += M_SQRT1_2;
        matrix[SIDE_RIGHT][BACK_RIGHT] += M_SQRT1_2;
      } else {
        matrix[SIDE_LEFT][BACK_LEFT] += 1.0;
        matrix[SIDE_RIGHT][BACK_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][BACK_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][BACK_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_SIDE_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      /* if back channels do not exist in the input, just copy side
         channels to back channels, otherwise mix side into back */
      if (in_ch_layout & CHANNEL_BACK_LEFT) {
        matrix[BACK_LEFT][SIDE_LEFT] += M_SQRT1_2;
        matrix[BACK_RIGHT][SIDE_RIGHT] += M_SQRT1_2;
      } else {
        matrix[BACK_LEFT][SIDE_LEFT] += 1.0;
        matrix[BACK_RIGHT][SIDE_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][SIDE_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][SIDE_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][SIDE_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][SIDE_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][SIDE_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][SIDE_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_FRONT_LEFT_OF_CENTER) {
    if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][FRONT_LEFT_OF_CENTER] += 1.0;
      matrix[FRONT_RIGHT][FRONT_RIGHT_OF_CENTER] += 1.0;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT_OF_CENTER] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT_OF_CENTER] += M_SQRT1_2;
    }
  }
  /* mix LFE into front left/right or center */
  if (unaccounted & CHANNEL_LOW_FREQUENCY) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][LOW_FREQUENCY] += _lfe_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
    }
  }

  // Normalize the conversion matrix.
  for (uint32_t out_i = 0, i = 0; i < CHANNELS_MAX; i++) {
    double sum = 0;
    int in_i = 0;
    if ((out_ch_layout & (1U << i)) == 0) {
      continue;
    }
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      if ((in_ch_layout & (1U << j)) == 0) {
        continue;
      }
      if (i < FF_ARRAY_ELEMS(matrix) && j < FF_ARRAY_ELEMS(matrix[0])) {
        _matrix[out_i][in_i] = matrix[i][j];
      } else {
        _matrix[out_i][in_i] =
            i == j && (in_ch_layout & out_ch_layout & (1U << i));
      }
      sum += fabs(_matrix[out_i][in_i]);
      in_i++;
    }
    maxcoef = std::max(maxcoef, sum);
    out_i++;
  }

  if (_format == CUBEB_SAMPLE_S16NE) {
    maxval = 1.0;
  } else {
    maxval = INT_MAX;
  }

  // Normalize matrix if needed.
  if (maxcoef > maxval) {
    maxcoef /= maxval;
    for (uint32_t i = 0; i < CHANNELS_MAX; i++)
      for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
        _matrix[i][j] /= maxcoef;
      }
  }

  if (_format == CUBEB_SAMPLE_FLOAT32NE) {
    for (uint32_t i = 0; i < FF_ARRAY_ELEMS(_matrix); i++) {
      for (uint32_t j = 0; j < FF_ARRAY_ELEMS(_matrix[0]); j++) {
        _matrix_flt[i][j] = _matrix[i][j];
      }
    }
  }

  return 0;
}